

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O3

void Rtm_ManFree(Rtm_Man_t *p)

{
  Vec_Ptr_t *pVVar1;
  void **ppvVar2;
  
  pVVar1 = p->vObjs;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vPis;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  pVVar1 = p->vPos;
  ppvVar2 = pVVar1->pArray;
  if (ppvVar2 != (void **)0x0) {
    free(ppvVar2);
  }
  free(pVVar1);
  Aig_MmFlexStop(p->pMem,0);
  if (p->pExtra != (uint *)0x0) {
    free(p->pExtra);
  }
  free(p);
  return;
}

Assistant:

void Rtm_ManFree( Rtm_Man_t * p )
{
    Vec_PtrFree( p->vObjs );
    Vec_PtrFree( p->vPis );
    Vec_PtrFree( p->vPos );
    Aig_MmFlexStop( p->pMem, 0 );
    ABC_FREE( p->pExtra );
    ABC_FREE( p );
}